

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O2

int cuddResizeTableZdd(DdManager *unique,int index)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  DdSubtable *pDVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  DdNode **ppDVar9;
  DdSubtable *pDVar10;
  int *piVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  size_t __size;
  ulong uVar17;
  
  iVar6 = unique->maxSizeZ;
  uVar7 = unique->initSlots;
  uVar17 = (ulong)uVar7;
  uVar3 = unique->sizeZ;
  lVar16 = (long)(int)uVar3;
  if (index < iVar6) {
    for (; lVar16 <= index; lVar16 = lVar16 + 1) {
      unique->subtableZ[lVar16].slots = uVar7;
      iVar6 = cuddComputeFloorLog2(uVar7);
      pDVar10 = unique->subtableZ;
      pDVar10[lVar16].shift = 0x20 - iVar6;
      pDVar10[lVar16].keys = 0;
      pDVar10[lVar16].maxKeys = uVar7 * 4;
      pDVar10[lVar16].dead = 0;
      unique->permZ[lVar16] = (int)lVar16;
      unique->invpermZ[lVar16] = (int)lVar16;
      ppDVar9 = (DdNode **)malloc(uVar17 * 8);
      pDVar10[lVar16].nodelist = ppDVar9;
      if (ppDVar9 == (DdNode **)0x0) goto LAB_0066eba5;
      for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
        ppDVar9[uVar14] = (DdNode *)0x0;
      }
    }
LAB_0066ebfe:
    unique->slots = unique->slots + ((index + 1) - unique->sizeZ) * uVar7;
    ddFixLimits(unique);
    unique->sizeZ = index + 1;
    iVar6 = unique->autoDynZ;
    unique->autoDynZ = 0;
    cuddZddFreeUniv(unique);
    iVar8 = cuddZddInitUniv(unique);
    uVar7 = (uint)(iVar8 != 0);
    unique->autoDynZ = iVar6;
  }
  else {
    iVar8 = index + 10;
    pDVar10 = (DdSubtable *)malloc((long)iVar8 * 0x38);
    if (pDVar10 != (DdSubtable *)0x0) {
      __size = (long)iVar8 << 2;
      piVar11 = (int *)malloc(__size);
      if (piVar11 != (int *)0x0) {
        piVar12 = (int *)malloc(__size);
        if (piVar12 != (int *)0x0) {
          unique->memused =
               unique->memused + ((ulong)(uVar7 + 1) * 8 + 0x40) * (long)(iVar8 - iVar6);
          if (unique->maxSize < iVar8) {
            free(unique->stack);
            ppDVar9 = (DdNode **)malloc((long)index * 8 + 0x58);
            unique->stack = ppDVar9;
            if (ppDVar9 == (DdNode **)0x0) goto LAB_0066eba5;
            *ppDVar9 = (DdNode *)0x0;
            iVar6 = unique->maxSize;
            if (unique->maxSize < unique->maxSizeZ) {
              iVar6 = unique->maxSizeZ;
            }
            unique->memused = unique->memused + (long)(iVar8 - iVar6) * 8;
          }
          lVar13 = 0;
          uVar14 = 0;
          if (0 < (int)uVar3) {
            uVar14 = (ulong)uVar3;
          }
          for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
            pDVar4 = unique->subtableZ;
            puVar1 = (undefined8 *)((long)&pDVar4->shift + lVar13);
            uVar5 = puVar1[1];
            puVar2 = (undefined8 *)((long)&pDVar10->shift + lVar13);
            *puVar2 = *puVar1;
            puVar2[1] = uVar5;
            *(undefined4 *)((long)&pDVar10->dead + lVar13) =
                 *(undefined4 *)((long)&pDVar4->dead + lVar13);
            *(undefined8 *)((long)&pDVar10->nodelist + lVar13) =
                 *(undefined8 *)((long)&pDVar4->nodelist + lVar13);
            piVar11[uVar15] = unique->permZ[uVar15];
            piVar12[uVar15] = unique->invpermZ[uVar15];
            lVar13 = lVar13 + 0x38;
          }
          for (; lVar16 <= index; lVar16 = lVar16 + 1) {
            pDVar10[lVar16].slots = uVar7;
            iVar6 = cuddComputeFloorLog2(uVar7);
            pDVar10[lVar16].shift = 0x20 - iVar6;
            pDVar10[lVar16].keys = 0;
            pDVar10[lVar16].maxKeys = uVar7 * 4;
            pDVar10[lVar16].dead = 0;
            piVar11[lVar16] = (int)lVar16;
            piVar12[lVar16] = (int)lVar16;
            ppDVar9 = (DdNode **)malloc(uVar17 * 8);
            pDVar10[lVar16].nodelist = ppDVar9;
            if (ppDVar9 == (DdNode **)0x0) goto LAB_0066eba5;
            for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
              ppDVar9[uVar14] = (DdNode *)0x0;
            }
          }
          free(unique->subtableZ);
          unique->subtableZ = pDVar10;
          unique->maxSizeZ = iVar8;
          free(unique->permZ);
          unique->permZ = piVar11;
          free(unique->invpermZ);
          unique->invpermZ = piVar12;
          goto LAB_0066ebfe;
        }
      }
    }
LAB_0066eba5:
    unique->errorCode = CUDD_MEMORY_OUT;
    uVar7 = 0;
  }
  return uVar7;
}

Assistant:

int
cuddResizeTableZdd(
  DdManager * unique,
  int  index)
{
    DdSubtable *newsubtables;
    DdNodePtr *newnodelist;
    int oldsize,newsize;
    int i,j,reorderSave;
    unsigned int numSlots = unique->initSlots;
    int *newperm, *newinvperm;

    oldsize = unique->sizeZ;
    /* Easy case: there is still room in the current table. */
    if (index < unique->maxSizeZ) {
        for (i = oldsize; i <= index; i++) {
            unique->subtableZ[i].slots = numSlots;
            unique->subtableZ[i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            unique->subtableZ[i].keys = 0;
            unique->subtableZ[i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            unique->subtableZ[i].dead = 0;
            unique->permZ[i] = i;
            unique->invpermZ[i] = i;
            newnodelist = unique->subtableZ[i].nodelist =
                ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = NULL;
            }
        }
    } else {
        /* The current table is too small: we need to allocate a new,
        ** larger one; move all old subtables, and initialize the new
        ** subtables up to index included.
        */
        newsize = index + DD_DEFAULT_RESIZE;
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "Increasing the ZDD table size from %d to %d\n",
            unique->maxSizeZ, newsize);
#endif
        newsubtables = ABC_ALLOC(DdSubtable,newsize);
        if (newsubtables == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        newperm = ABC_ALLOC(int,newsize);
        if (newperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        newinvperm = ABC_ALLOC(int,newsize);
        if (newinvperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        unique->memused += (newsize - unique->maxSizeZ) * ((numSlots+1) *
            sizeof(DdNode *) + 2 * sizeof(int) + sizeof(DdSubtable));
        if (newsize > unique->maxSize) {
            ABC_FREE(unique->stack);
            unique->stack = ABC_ALLOC(DdNodePtr,newsize + 1);
            if (unique->stack == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            unique->stack[0] = NULL; /* to suppress harmless UMR */
            unique->memused +=
                (newsize - ddMax(unique->maxSize,unique->maxSizeZ))
                * sizeof(DdNode *);
        }
        for (i = 0; i < oldsize; i++) {
            newsubtables[i].slots = unique->subtableZ[i].slots;
            newsubtables[i].shift = unique->subtableZ[i].shift;
            newsubtables[i].keys = unique->subtableZ[i].keys;
            newsubtables[i].maxKeys = unique->subtableZ[i].maxKeys;
            newsubtables[i].dead = unique->subtableZ[i].dead;
            newsubtables[i].nodelist = unique->subtableZ[i].nodelist;
            newperm[i] = unique->permZ[i];
            newinvperm[i] = unique->invpermZ[i];
        }
        for (i = oldsize; i <= index; i++) {
            newsubtables[i].slots = numSlots;
            newsubtables[i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            newsubtables[i].keys = 0;
            newsubtables[i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            newsubtables[i].dead = 0;
            newperm[i] = i;
            newinvperm[i] = i;
            newnodelist = newsubtables[i].nodelist = ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = NULL;
            }
        }
        ABC_FREE(unique->subtableZ);
        unique->subtableZ = newsubtables;
        unique->maxSizeZ = newsize;
        ABC_FREE(unique->permZ);
        unique->permZ = newperm;
        ABC_FREE(unique->invpermZ);
        unique->invpermZ = newinvperm;
    }
    unique->slots += (index + 1 - unique->sizeZ) * numSlots;
    ddFixLimits(unique);
    unique->sizeZ = index + 1;

    /* Now that the table is in a coherent state, update the ZDD
    ** universe. We need to temporarily disable reordering,
    ** because we cannot reorder without universe in place.
    */

    reorderSave = unique->autoDynZ;
    unique->autoDynZ = 0;
    cuddZddFreeUniv(unique);
    if (!cuddZddInitUniv(unique)) {
        unique->autoDynZ = reorderSave;
        return(0);
    }
    unique->autoDynZ = reorderSave;

    return(1);

}